

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O1

Gia_Man_t * Gia_ManCofTest(Gia_Man_t *pGia,int nFrameMax,int nConfMax,int nTimeMax,int fVerbose)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Ccf_Man_t *p;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pGVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int level;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  timespec ts;
  long local_58;
  timespec local_50;
  uint local_3c;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    local_58 = -1;
  }
  else {
    local_58 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (pGia->vCos->nSize - pGia->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pGia) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCCof.c"
                  ,0x112,"Gia_Man_t *Gia_ManCofTest(Gia_Man_t *, int, int, int, int)");
  }
  local_58 = local_58 + (long)nTimeMax * 1000000;
  p = Ccf_ManStart(pGia,nFrameMax,nConfMax,nTimeMax,fVerbose);
  if (nTimeMax != 0) {
    p->pSat->nRuntimeLimit = local_58;
  }
  local_3c = nTimeMax;
  local_38 = lVar8;
  if (nFrameMax < 1) {
    bVar2 = true;
    iVar3 = -1;
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    bVar2 = false;
    do {
      if (fVerbose != 0) {
        printf("ITER %3d :\n",uVar9);
      }
      uVar12 = (int)uVar9 + 1;
      pGVar6 = (Gia_Man_t *)Gia_ManUnrollAdd(p->pUnr,uVar12);
      p->pFrames = pGVar6;
      Gia_ManCofExtendSolver(p);
      iVar3 = Gia_ManUnrollLastLit(p->pUnr);
      iVar3 = Gia_ManCofGetReachable(p,iVar3);
      if (iVar3 != 0) goto LAB_007065be;
      Gia_ManSetPhase(p->pFrames);
      pGVar6 = p->pFrames;
      uVar1 = pGVar6->vCos->nSize;
      iVar3 = 0;
      uVar4 = uVar1 - pGVar6->nRegs;
      if (uVar4 == 0 || (int)uVar1 < pGVar6->nRegs) {
        uVar4 = 0;
      }
      else {
        uVar10 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar10 = 0;
        }
        uVar13 = 0;
        do {
          if (uVar10 == uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar5 = pGVar6->vCos->pArray[uVar13];
          if (((long)iVar5 < 0) || (pGVar6->nObjs <= iVar5)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar6->pObjs == (Gia_Obj_t *)0x0) {
LAB_00706583:
            uVar4 = (uint)uVar13;
            break;
          }
          if (*(long *)(pGVar6->pObjs + iVar5) < 0) {
            printf("Property failed in frame %d.\n",uVar9);
            bVar2 = true;
            goto LAB_00706583;
          }
          uVar13 = uVar13 + 1;
        } while (uVar4 != uVar13);
      }
      if ((int)uVar4 < p->pFrames->vCos->nSize - p->pFrames->nRegs) goto LAB_007065be;
      uVar9 = (ulong)uVar12;
    } while (uVar12 != nFrameMax);
    uVar9 = (ulong)(uint)nFrameMax;
LAB_007065be:
    bVar2 = !bVar2;
  }
  uVar12 = (uint)uVar9;
  if (local_58 != 0) {
    iVar5 = clock_gettime(3,&local_50);
    if (iVar5 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    if (local_58 < lVar8) {
      printf("Runtime limit (%d sec) is reached after %d frames.  ",(ulong)local_3c,uVar9);
      goto LAB_0070666a;
    }
  }
  if (uVar12 == nFrameMax) {
    pcVar11 = "Completed %d frames without converging.  ";
  }
  else if (iVar3 == -1) {
    uVar12 = uVar12 - 1;
    pcVar11 = "Conflict limit or timeout is reached after %d frames.  ";
  }
  else {
    if (iVar3 != 1) goto LAB_0070666a;
    uVar12 = uVar12 - 1;
    pcVar11 = "Backward reachability converged after %d iterations.  ";
  }
  printf(pcVar11,(ulong)uVar12);
LAB_0070666a:
  level = 3;
  iVar5 = clock_gettime(3,&local_50);
  if (iVar5 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  lVar8 = lVar8 + local_38;
  Abc_Print(level,"%s =","Runtime");
  Abc_Print(level,"%9.2f sec\n",(double)lVar8 / 1000000.0);
  if (bVar2) {
    pcVar11 = "Property is undecided.";
    if (iVar3 == 1) {
      pcVar11 = "Property holds.";
    }
    puts(pcVar11);
  }
  Gia_ManHashStop(p->pFrames);
  pGVar6 = p->pFrames;
  p->pFrames = (Gia_Man_t *)0x0;
  Ccf_ManStop(p);
  pGVar7 = Gia_ManCleanup(pGVar6);
  Gia_ManStop(pGVar6);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManCofTest( Gia_Man_t * pGia, int nFrameMax, int nConfMax, int nTimeMax, int fVerbose )
{ 
    Gia_Man_t * pNew;
    Ccf_Man_t * p;
    Gia_Obj_t * pObj;
    int f, i, Lit, RetValue = -1, fFailed = 0;
    abctime nTimeToStop = Abc_Clock() + nTimeMax * CLOCKS_PER_SEC;
    abctime clk = Abc_Clock();
    assert( Gia_ManPoNum(pGia) == 1 );

    // create reachability manager
    p = Ccf_ManStart( pGia, nFrameMax, nConfMax, nTimeMax, fVerbose );

    // set runtime limit
    if ( nTimeMax )
        sat_solver_set_runtime_limit( p->pSat, nTimeToStop );

    // perform backward image computation
    for ( f = 0; f < nFrameMax; f++ )
    {
        if ( fVerbose ) 
            printf( "ITER %3d :\n", f );
        // add to the mapping of nodes
        p->pFrames = (Gia_Man_t *)Gia_ManUnrollAdd( p->pUnr, f+1 );
        // add SAT clauses
        Gia_ManCofExtendSolver( p );
        // return output literal
        Lit = Gia_ManUnrollLastLit( p->pUnr );
        // derives cofactors of the property literal till all states are blocked
        RetValue = Gia_ManCofGetReachable( p, Lit );
        if ( RetValue )
            break;

        // check the property output
        Gia_ManSetPhase( p->pFrames );
        Gia_ManForEachPo( p->pFrames, pObj, i )
            if ( pObj->fPhase )
            {
                printf( "Property failed in frame %d.\n", f );
                fFailed = 1;
                break;
            }
        if ( i < Gia_ManPoNum(p->pFrames) )
            break;
    }

    // report the result
    if ( nTimeToStop && Abc_Clock() > nTimeToStop )
        printf( "Runtime limit (%d sec) is reached after %d frames.  ", nTimeMax, f );
    else if ( f == nFrameMax )
        printf( "Completed %d frames without converging.  ", f );
    else if ( RetValue == 1 )
        printf( "Backward reachability converged after %d iterations.  ", f-1 );
    else if ( RetValue == -1 )
        printf( "Conflict limit or timeout is reached after %d frames.  ", f-1 );
    Abc_PrintTime( 1, "Runtime", Abc_Clock() - clk );

    if ( !fFailed && RetValue == 1 )
        printf( "Property holds.\n" );
    else if ( !fFailed )
        printf( "Property is undecided.\n" );

    // get the resulting AIG manager
    Gia_ManHashStop( p->pFrames );
    pNew = p->pFrames;  p->pFrames = NULL;
    Ccf_ManStop( p );

    // cleanup
//    if ( fVerbose )
//        Gia_ManPrintStats( pNew, 0 );
    pNew = Gia_ManCleanup( pGia = pNew );
    Gia_ManStop( pGia );
//    if ( fVerbose )
//        Gia_ManPrintStats( pNew, 0 );
    return pNew;   
}